

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::do_bind(Server *this)

{
  in_addr_t iVar1;
  int iVar2;
  ulong uVar3;
  sockaddr_in serv_addr;
  sockaddr local_28;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_data._0_2_ = this->port_no << 8 | this->port_no >> 8;
  local_28.sa_family = 2;
  local_28.sa_data._2_4_ = 0;
  iVar1 = inet_addr((this->server_addr)._M_dataplus._M_p);
  local_28.sa_data._2_4_ = iVar1;
  uVar3 = (ulong)(uint)this->server_sock;
  iVar2 = bind(this->server_sock,&local_28,0x10);
  if (-1 < iVar2) {
    return;
  }
  do_bind();
  listen(*(int *)(uVar3 + 0x5c),5);
  return;
}

Assistant:

void Server::do_bind() {
    struct sockaddr_in serv_addr;
    bzero((char *) &serv_addr, sizeof(serv_addr));
    serv_addr.sin_family = AF_INET;
    serv_addr.sin_port = htons(this->port_no);
    serv_addr.sin_addr.s_addr = inet_addr(this->server_addr.c_str());
    IF_NEGATIVE_EXIT(bind(this->server_sock, (struct sockaddr *) &serv_addr, sizeof(serv_addr)));
}